

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwtest2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char cVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double local_bb0;
  double local_ba8;
  NaReal fOut;
  NaReal fIn;
  NaConfigPart *conf2_list [1];
  NaConfigPart *conf1_list [1];
  NaReal fTmp;
  NaTransFunc dtf2;
  NaConfigPart local_b50 [232];
  NaTransFunc dtf1;
  NaConfigFile conf2_file;
  NaConfigFile conf1_file;
  
  if (argc - 8U < 0xfffffffe) {
    iVar12 = 1;
    fwrite("Error: need 5 or 6 arguments\n",0x1d,1,_stderr);
    puts("Usage: dwtest2 ContrTrFunc PlantTrFunc SignalSeries NoiseSeries OutSeries [InSeries]");
  }
  else {
    if (argc == 7) {
      pcVar10 = argv[6];
    }
    else {
      pcVar10 = (char *)0x0;
    }
    pcVar1 = argv[3];
    pcVar2 = argv[4];
    pcVar3 = argv[5];
    NaOpenLogFile("dwtest.log");
    NaTransFunc::NaTransFunc(&dtf1);
    NaTransFunc::NaTransFunc(&dtf2);
    conf2_list[0] = local_b50;
    NaConfigFile::NaConfigFile(&conf1_file,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::NaConfigFile(&conf2_file,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::AddPartitions((uint)&conf1_file,(NaConfigPart **)0x1);
    NaConfigFile::AddPartitions((uint)&conf2_file,(NaConfigPart **)0x1);
    NaConfigFile::LoadFromFile((char *)&conf1_file);
    NaConfigFile::LoadFromFile((char *)&conf2_file);
    plVar6 = (long *)OpenInputDataFile(pcVar1);
    plVar7 = (long *)OpenInputDataFile(pcVar2);
    plVar8 = (long *)OpenOutputDataFile(pcVar3,bdtAuto,1);
    if (pcVar10 == (char *)0x0) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = (long *)OpenOutputDataFile(pcVar10,bdtAuto,1);
    }
    (**(code **)(*plVar6 + 0x28))(plVar6);
    (**(code **)(*plVar7 + 0x28))(plVar7);
    NaTransFunc::Reset();
    NaTransFunc::Reset();
    local_ba8 = 0.0;
    local_bb0 = 0.0;
    uVar4 = 1;
    do {
      uVar11 = uVar4;
      dVar13 = (double)(**(code **)(*plVar6 + 0x18))(plVar6,0);
      dVar14 = (double)(**(code **)(*plVar7 + 0x18))(plVar7,0);
      fIn = (dVar14 + dVar13) - local_ba8;
      NaTransFunc::Function((double *)&dtf1,&fIn);
      NaTransFunc::Function((double *)&dtf2,&fTmp);
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 0x30))(plVar9);
        (**(code **)(*plVar9 + 0x10))(fIn,plVar9);
      }
      (**(code **)(*plVar8 + 0x30))(plVar8);
      (**(code **)(*plVar8 + 0x10))(fOut,plVar8);
      local_ba8 = fOut;
      cVar5 = (**(code **)(*plVar6 + 0x20))(plVar6);
      local_bb0 = local_bb0 + (fOut - dVar13) * (fOut - dVar13);
      if (cVar5 == '\0') break;
      cVar5 = (**(code **)(*plVar7 + 0x20))(plVar7);
      uVar4 = uVar11 + 1;
    } while (cVar5 != '\0');
    iVar12 = 0;
    printf("Series length=%d samples\n",(ulong)uVar11);
    printf("Mean squared error=%g\n",local_bb0 / (double)(int)uVar11);
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 8))(plVar9);
    }
    (**(code **)(*plVar8 + 8))(plVar8);
    (**(code **)(*plVar7 + 8))(plVar7);
    (**(code **)(*plVar6 + 8))(plVar6);
    NaConfigFile::~NaConfigFile(&conf2_file);
    NaConfigFile::~NaConfigFile(&conf1_file);
    NaTransFunc::~NaTransFunc(&dtf2);
    NaTransFunc::~NaTransFunc(&dtf1);
  }
  return iVar12;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6 && argc != 7)
    {
      fprintf(stderr, "Error: need 5 or 6 arguments\n");
      printf("Usage: dwtest2 ContrTrFunc PlantTrFunc SignalSeries NoiseSeries"\
	     " OutSeries [InSeries]\n");
      return 1;
    }

  char	*dtf1_file = argv[1];
  char	*dtf2_file = argv[2];
  char	*signal_file = argv[3];
  char	*noise_file = argv[4];
  char	*out_file = argv[5];
  char	*in_file = NULL;

  if(argc == 7)
    in_file = argv[6];

  NaOpenLogFile("dwtest.log");

  try{
    int			n;
    NaReal		e2, e;
    NaTransFunc		dtf1, dtf2;
    NaConfigPart	*conf1_list[] = { &dtf1 };
    NaConfigPart	*conf2_list[] = { &dtf2 };
    NaConfigFile	conf1_file(";NeuCon transfer", 1, 0);
    NaConfigFile	conf2_file(";NeuCon transfer", 1, 0);
    conf1_file.AddPartitions(NaNUMBER(conf1_list), conf1_list);
    conf2_file.AddPartitions(NaNUMBER(conf2_list), conf2_list);
    conf1_file.LoadFromFile(dtf1_file);
    conf2_file.LoadFromFile(dtf2_file);

    NaDataFile	*dfSignal = OpenInputDataFile(signal_file);
    NaDataFile	*dfNoise = OpenInputDataFile(noise_file);
    NaDataFile	*dfOut = OpenOutputDataFile(out_file, bdtAuto, 1);
    NaDataFile	*dfIn = NULL;

    if(NULL != in_file)
      dfIn = OpenOutputDataFile(in_file, bdtAuto, 1);

    dfSignal->GoStartRecord();
    dfNoise->GoStartRecord();
    dtf1.Reset();
    dtf2.Reset();
    n = 0;
    e = 0.;
    e2 = 0.;
    do{
      ++n;
      NaReal	fSignal, fNoise, fIn, fOut, fTmp;
      fSignal = dfSignal->GetValue();
      fNoise = dfNoise->GetValue();

      fIn = fSignal + fNoise - e;
      dtf1.Function(&fIn, &fTmp);
      dtf2.Function(&fTmp, &fOut);

      if(NULL != dfIn)
	{
	  dfIn->AppendRecord();
	  dfIn->SetValue(fIn);
	}

      dfOut->AppendRecord();
      dfOut->SetValue(fOut);

      e = fOut;
      e2 += (fOut - fSignal) * (fOut - fSignal);
    }while(dfSignal->GoNextRecord() && dfNoise->GoNextRecord());

    printf("Series length=%d samples\n", n);
    printf("Mean squared error=%g\n", e2/n);

    delete dfIn;
    delete dfOut;
    delete dfNoise;
    delete dfSignal;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}